

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O1

btScalar __thiscall btRaycastVehicle::rayCast(btRaycastVehicle *this,btWheelInfo *wheel)

{
  btVector3 *pbVar1;
  btScalar *pbVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  btRigidBody *pbVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  btScalar bVar13;
  btScalar bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  btVehicleRaycasterResult rayResults;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined8 local_2c;
  undefined8 uStack_24;
  
  updateWheelTransformsWS(this,wheel,false);
  bVar13 = btWheelInfo::getSuspensionRestLength(wheel);
  fVar16 = bVar13 + wheel->m_wheelsRadius;
  uVar7 = *(undefined8 *)(wheel->m_raycastInfo).m_hardPointWS.m_floats;
  uVar8 = *(undefined8 *)(wheel->m_raycastInfo).m_wheelDirectionWS.m_floats;
  pbVar1 = &(wheel->m_raycastInfo).m_contactPointWS;
  auVar11._4_4_ = fVar16 * (float)((ulong)uVar8 >> 0x20) + (float)((ulong)uVar7 >> 0x20);
  auVar11._0_4_ = fVar16 * (float)uVar8 + (float)uVar7;
  auVar11._8_4_ =
       (wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[2] * fVar16 +
       (wheel->m_raycastInfo).m_hardPointWS.m_floats[2];
  auVar11._12_4_ = 0;
  *(undefined1 (*) [16])(wheel->m_raycastInfo).m_contactPointWS.m_floats = auVar11;
  lVar12 = (**(code **)(*(long *)this->m_vehicleRaycaster + 0x10))
                     (this->m_vehicleRaycaster,&(wheel->m_raycastInfo).m_hardPointWS,pbVar1);
  (wheel->m_raycastInfo).m_groundObject = (void *)0x0;
  if (lVar12 == 0) {
    bVar13 = btWheelInfo::getSuspensionRestLength(wheel);
    (wheel->m_raycastInfo).m_suspensionLength = bVar13;
    wheel->m_suspensionRelativeVelocity = 0.0;
    auVar10._8_4_ = -(wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[2];
    auVar10._0_8_ =
         *(ulong *)(wheel->m_raycastInfo).m_wheelDirectionWS.m_floats ^ 0x8000000080000000;
    auVar10._12_4_ = 0;
    *(undefined1 (*) [16])(wheel->m_raycastInfo).m_contactNormalWS.m_floats = auVar10;
    bVar13 = -1.0;
    bVar14 = 1.0;
  }
  else {
    bVar13 = fVar16 * -1.0;
    *(undefined8 *)(wheel->m_raycastInfo).m_contactNormalWS.m_floats = local_2c;
    *(undefined8 *)((wheel->m_raycastInfo).m_contactNormalWS.m_floats + 2) = uStack_24;
    (wheel->m_raycastInfo).m_isInContact = true;
    btActionInterface::getFixedBody();
    (wheel->m_raycastInfo).m_groundObject = &btActionInterface::getFixedBody::s_fixed;
    (wheel->m_raycastInfo).m_suspensionLength = bVar13 - wheel->m_wheelsRadius;
    bVar14 = btWheelInfo::getSuspensionRestLength(wheel);
    fVar16 = bVar14 - wheel->m_maxSuspensionTravelCm * 0.01;
    bVar14 = btWheelInfo::getSuspensionRestLength(wheel);
    fVar15 = wheel->m_maxSuspensionTravelCm * 0.01 + bVar14;
    pbVar2 = &(wheel->m_raycastInfo).m_suspensionLength;
    if (*pbVar2 <= fVar16 && fVar16 != *pbVar2) {
      (wheel->m_raycastInfo).m_suspensionLength = fVar16;
    }
    if (fVar15 < (wheel->m_raycastInfo).m_suspensionLength) {
      (wheel->m_raycastInfo).m_suspensionLength = fVar15;
    }
    *(undefined8 *)pbVar1->m_floats = local_3c;
    *(undefined8 *)((wheel->m_raycastInfo).m_contactPointWS.m_floats + 2) = uStack_34;
    fVar16 = (wheel->m_raycastInfo).m_contactNormalWS.m_floats[0];
    fVar15 = (wheel->m_raycastInfo).m_contactNormalWS.m_floats[1];
    fVar3 = (wheel->m_raycastInfo).m_contactNormalWS.m_floats[2];
    fVar17 = (wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[2] * fVar3 +
             (wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[0] * fVar16 +
             (wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[1] * fVar15;
    if (-0.1 <= fVar17) {
      wheel->m_suspensionRelativeVelocity = 0.0;
      bVar14 = 10.0;
    }
    else {
      pbVar9 = this->m_chassisBody;
      fVar19 = (wheel->m_raycastInfo).m_contactPointWS.m_floats[1] -
               (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
      fVar18 = (wheel->m_raycastInfo).m_contactPointWS.m_floats[0] -
               (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
      fVar4 = (pbVar9->m_angularVelocity).m_floats[0];
      fVar5 = (pbVar9->m_angularVelocity).m_floats[1];
      fVar20 = (wheel->m_raycastInfo).m_contactPointWS.m_floats[2] -
               (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      fVar6 = (pbVar9->m_angularVelocity).m_floats[2];
      bVar14 = -1.0 / fVar17;
      wheel->m_suspensionRelativeVelocity =
           (fVar3 * ((fVar4 * fVar19 - fVar18 * fVar5) + (pbVar9->m_linearVelocity).m_floats[2]) +
           fVar16 * ((fVar5 * fVar20 - fVar19 * fVar6) + (pbVar9->m_linearVelocity).m_floats[0]) +
           fVar15 * ((fVar18 * fVar6 - fVar20 * fVar4) + (pbVar9->m_linearVelocity).m_floats[1])) *
           bVar14;
    }
  }
  wheel->m_clippedInvContactDotSuspension = bVar14;
  return bVar13;
}

Assistant:

btScalar btRaycastVehicle::rayCast(btWheelInfo& wheel)
{
	updateWheelTransformsWS( wheel,false);

	
	btScalar depth = -1;
	
	btScalar raylen = wheel.getSuspensionRestLength()+wheel.m_wheelsRadius;

	btVector3 rayvector = wheel.m_raycastInfo.m_wheelDirectionWS * (raylen);
	const btVector3& source = wheel.m_raycastInfo.m_hardPointWS;
	wheel.m_raycastInfo.m_contactPointWS = source + rayvector;
	const btVector3& target = wheel.m_raycastInfo.m_contactPointWS;

	btScalar param = btScalar(0.);
	
	btVehicleRaycaster::btVehicleRaycasterResult	rayResults;

	btAssert(m_vehicleRaycaster);

	void* object = m_vehicleRaycaster->castRay(source,target,rayResults);

	wheel.m_raycastInfo.m_groundObject = 0;

	if (object)
	{
		param = rayResults.m_distFraction;
		depth = raylen * rayResults.m_distFraction;
		wheel.m_raycastInfo.m_contactNormalWS  = rayResults.m_hitNormalInWorld;
		wheel.m_raycastInfo.m_isInContact = true;
		
		wheel.m_raycastInfo.m_groundObject = &getFixedBody();///@todo for driving on dynamic/movable objects!;
		//wheel.m_raycastInfo.m_groundObject = object;


		btScalar hitDistance = param*raylen;
		wheel.m_raycastInfo.m_suspensionLength = hitDistance - wheel.m_wheelsRadius;
		//clamp on max suspension travel

		btScalar  minSuspensionLength = wheel.getSuspensionRestLength() - wheel.m_maxSuspensionTravelCm*btScalar(0.01);
		btScalar maxSuspensionLength = wheel.getSuspensionRestLength()+ wheel.m_maxSuspensionTravelCm*btScalar(0.01);
		if (wheel.m_raycastInfo.m_suspensionLength < minSuspensionLength)
		{
			wheel.m_raycastInfo.m_suspensionLength = minSuspensionLength;
		}
		if (wheel.m_raycastInfo.m_suspensionLength > maxSuspensionLength)
		{
			wheel.m_raycastInfo.m_suspensionLength = maxSuspensionLength;
		}

		wheel.m_raycastInfo.m_contactPointWS = rayResults.m_hitPointInWorld;

		btScalar denominator= wheel.m_raycastInfo.m_contactNormalWS.dot( wheel.m_raycastInfo.m_wheelDirectionWS );

		btVector3 chassis_velocity_at_contactPoint;
		btVector3 relpos = wheel.m_raycastInfo.m_contactPointWS-getRigidBody()->getCenterOfMassPosition();

		chassis_velocity_at_contactPoint = getRigidBody()->getVelocityInLocalPoint(relpos);

		btScalar projVel = wheel.m_raycastInfo.m_contactNormalWS.dot( chassis_velocity_at_contactPoint );

		if ( denominator >= btScalar(-0.1))
		{
			wheel.m_suspensionRelativeVelocity = btScalar(0.0);
			wheel.m_clippedInvContactDotSuspension = btScalar(1.0) / btScalar(0.1);
		}
		else
		{
			btScalar inv = btScalar(-1.) / denominator;
			wheel.m_suspensionRelativeVelocity = projVel * inv;
			wheel.m_clippedInvContactDotSuspension = inv;
		}
			
	} else
	{
		//put wheel info as in rest position
		wheel.m_raycastInfo.m_suspensionLength = wheel.getSuspensionRestLength();
		wheel.m_suspensionRelativeVelocity = btScalar(0.0);
		wheel.m_raycastInfo.m_contactNormalWS = - wheel.m_raycastInfo.m_wheelDirectionWS;
		wheel.m_clippedInvContactDotSuspension = btScalar(1.0);
	}

	return depth;
}